

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VCClusterAniso::energy(VCClusterAniso *this)

{
  ResScalar RVar1;
  ResScalar RVar2;
  Vector3d zi;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_50 [24];
  Matrix3d *local_38;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_30;
  
  (*(this->super_VCCluster)._vptr_VCCluster[7])(local_50,this);
  local_38 = &this->sumK;
  local_30 = local_50;
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>,_false>
          ::run(local_50,(MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
                          *)&local_38);
  RVar2 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
          ::run(local_50,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->sumKPos);
  return RVar1 - (RVar2 + RVar2);
}

Assistant:

double VCClusterAniso::energy() {
	Vector3d zi = center();
	return zi.dot(sumK * zi) - 2 * zi.dot(sumKPos);
}